

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

uint64_t __thiscall Path::lastModifiedMs(Path *this)

{
  undefined1 local_b0 [8];
  stat st;
  bool ok;
  Path *this_local;
  
  stat((Path *)local_b0,(char *)this,(stat *)((long)st.__glibc_reserved + 0x17));
  if ((st.__glibc_reserved[2]._7_1_ & 1) == 0) {
    this_local = (Path *)0x0;
  }
  else {
    this_local = (Path *)(st.st_atim.tv_nsec * 1000 + (ulong)st.st_mtim.tv_sec / 1000000);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Path::lastModifiedMs() const
{
    bool ok;
    struct stat st = stat(&ok);
    if (!ok)
        return 0;

#ifdef HAVE_STATMTIM
    return st.st_mtim.tv_sec * static_cast<uint64_t>(1000) + st.st_mtim.tv_nsec / static_cast<uint64_t>(1000000);
#else
    return st.st_mtime * static_cast<uint64_t>(1000);
#endif
}